

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phi_sum.cpp
# Opt level: O2

int256_t * __thiscall
primesum::phi_sum(int256_t *__return_storage_ptr__,primesum *this,int128_t x,int64_t a)

{
  _anonymous_namespace_ *this_00;
  int y;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  primesum *ppVar4;
  ulong uVar5;
  long lVar6;
  int128_t *piVar7;
  long lVar8;
  _anonymous_namespace_ *this_01;
  primesum *in_RCX;
  long extraout_RDX;
  int64_t a_00;
  ulong extraout_RDX_00;
  _Vector_base<int,_std::allocator<int>_> *in_R8;
  undefined8 in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  primesum *local_f8;
  ulong uStack_f0;
  ulong local_e8;
  long lStack_e0;
  int256_t n;
  _Vector_base<int,_std::allocator<int>_> local_b0;
  int256_t fx;
  int256_t local_78;
  int256_t local_58;
  
  if (-a < (long)(ulong)((primesum *)0x7fffffffffffffff < this)) {
    if ((long)in_RCX < 10) {
      x_00._8_8_ = in_stack_fffffffffffffef0;
      x_00._0_8_ = in_stack_fffffffffffffee8;
      (anonymous_namespace)::phi_sum256<1,std::array<int,10ul>const&>
                (__return_storage_ptr__,(_anonymous_namespace_ *)this,(int128_t)x_00,a,
                 (array<int,_10UL> *)in_RCX);
    }
    else {
      generate_n_primes((vector<int,_std::allocator<int>_> *)&local_b0,(int64_t)in_RCX);
      local_e8 = 0;
      lStack_e0 = 0;
      local_f8 = (primesum *)0x0;
      uStack_f0 = 0;
      while (lVar6 = lStack_e0, uVar5 = local_e8, uVar1 = uStack_f0, ppVar4 = local_f8,
            0 < (long)in_RCX) {
        y = local_b0._M_impl.super__Vector_impl_data._M_start[(long)in_RCX];
        lVar8 = (long)y >> 0x3f;
        uVar2 = (ulong)((primesum *)(long)y < this);
        lVar3 = lVar8 - a;
        if ((SBORROW8(lVar8,a) != SBORROW8(lVar3,uVar2)) == (long)(lVar3 - uVar2) < 0) {
          int256_t::operator+(__return_storage_ptr__,(int256_t *)&local_f8,1);
          goto LAB_0010c8b6;
        }
        x_01._8_8_ = __return_storage_ptr__;
        x_01._0_8_ = in_stack_fffffffffffffee8;
        this_01 = (_anonymous_namespace_ *)
                  fast_div<__int128,int>((type *)this,(primesum *)a,(__int128)x_01,y);
        n.high._0_8_ = 0;
        n.high._8_8_ = 0;
        n.low._0_8_ = (primesum *)0x0;
        n.low._8_8_ = 0;
        this_00 = (_anonymous_namespace_ *)in_RCX + -1;
        if (-a_00 < (long)(ulong)((_anonymous_namespace_ *)0x7fffffffffffffff < this_01)) {
          in_R8 = &local_b0;
          x_02._8_8_ = __return_storage_ptr__;
          x_02._0_8_ = in_stack_fffffffffffffee8;
          (anonymous_namespace)::phi_sum256<_1,std::vector<int,std::allocator<int>>&>
                    (&fx,this_01,(int128_t)x_02,a_00,(vector<int,_std::allocator<int>_> *)this_00);
          n.high._0_8_ = (ulong)fx.high;
          n.high._8_8_ = fx.high._8_8_;
          n.low._0_8_ = (primesum *)fx.low;
          n.low._8_8_ = fx.low._8_8_;
        }
        else {
          n.low._0_8_ = (primesum *)
                        (anonymous_namespace)::phi_sum128<_1,std::vector<int,std::allocator<int>>&>
                                  ((int128_t *)this_01,this_00,(int64_t)&local_b0,
                                   -a_00 - (ulong)((_anonymous_namespace_ *)0x7fffffffffffffff <
                                                  this_01),
                                   (vector<int,_std::allocator<int>_> *)in_R8);
          n.high._0_8_ = (long)extraout_RDX_00 >> 0x3f;
          n.low._8_8_ = extraout_RDX_00;
          n.high._8_8_ = (ulong)n.high;
        }
        int256_t::operator*(&fx,&n,local_b0._M_impl.super__Vector_impl_data._M_start[(long)in_RCX]);
        local_f8 = ppVar4 + (long)(primesum *)fx.low;
        uStack_f0 = uVar1 + fx.low._8_8_ + (ulong)CARRY8((ulong)ppVar4,(ulong)(primesum *)fx.low);
        uVar1 = (ulong)(CARRY8(uVar1,fx.low._8_8_) ||
                       CARRY8(uVar1 + fx.low._8_8_,
                              (ulong)CARRY8((ulong)ppVar4,(ulong)(primesum *)fx.low)));
        local_e8 = uVar5 + (ulong)fx.high + uVar1;
        lStack_e0 = lVar6 + fx.high._8_8_ + (ulong)CARRY8(uVar5,(ulong)fx.high) +
                    (ulong)CARRY8(uVar5 + (ulong)fx.high,uVar1);
        in_RCX = (primesum *)this_00;
      }
      n.high._0_8_ = a >> 0x3f;
      n.low._0_8_ = this;
      n.low._8_8_ = a;
      n.high._8_8_ = (ulong)n.high;
      int256_t::operator+(&local_58,&n,1);
      int256_t::operator*(&local_78,&n,&local_58);
      fx.low._8_8_ = (ulong)local_78.high << 0x3f | local_78.low._8_8_ >> 1;
      fx.low._0_8_ = (primesum *)((ulong)local_78.low >> 1 | local_78.low._8_8_ << 0x3f);
      fx.high._0_8_ = (ulong)local_78.high >> 1 | local_78.high._8_8_ << 0x3f;
      fx.high._8_8_ = local_78.high._8_8_ >> 1;
      int256_t::operator*(&local_78,&fx,1);
      local_f8 = ppVar4 + (ulong)local_78.low;
      uStack_f0 = uVar1 + local_78.low._8_8_ + (ulong)CARRY8((ulong)ppVar4,(ulong)local_78.low);
      uVar1 = (ulong)(CARRY8(uVar1,local_78.low._8_8_) ||
                     CARRY8(uVar1 + local_78.low._8_8_,
                            (ulong)CARRY8((ulong)ppVar4,(ulong)local_78.low)));
      local_e8 = uVar5 + (ulong)local_78.high + uVar1;
      lStack_e0 = lVar6 + local_78.high._8_8_ + (ulong)CARRY8(uVar5,(ulong)local_78.high) +
                  (ulong)CARRY8(uVar5 + (ulong)local_78.high,uVar1);
      *(ulong *)&__return_storage_ptr__->high = local_e8;
      *(long *)((long)&__return_storage_ptr__->high + 8) = lStack_e0;
      *(primesum **)&__return_storage_ptr__->low = local_f8;
      *(ulong *)((long)&__return_storage_ptr__->low + 8) = uStack_f0;
LAB_0010c8b6:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_b0);
    }
  }
  else {
    piVar7 = phi_sum((int128_t *)this,in_RCX,a,0x7fffffffffffffff);
    *(long *)((long)&__return_storage_ptr__->low + 8) = extraout_RDX;
    *(int128_t **)&__return_storage_ptr__->low = piVar7;
    *(long *)((long)&__return_storage_ptr__->high + 8) = extraout_RDX >> 0x3f;
    *(long *)&__return_storage_ptr__->high = extraout_RDX >> 0x3f;
  }
  return __return_storage_ptr__;
}

Assistant:

int256_t phi_sum(int128_t x, int64_t a)
{
  if (x <= numeric_limits<int64_t>::max())
    return phi_sum((int64_t) x, a);

  if (a < 10)
    return phi_sum256<1>(x, a, small_primes_);
  else
    return phi_sum256<1>(x, a, generate_n_primes(a));
}